

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

bool __thiscall
ggml::cpu::aarch64::extra_buffer_type::supports_op
          (extra_buffer_type *this,ggml_backend_dev_t param_1,ggml_tensor *op)

{
  ggml_backend_buffer_type *pgVar1;
  ggml_backend_buffer *pgVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  tensor_traits *ptVar6;
  
  if ((((((op->op == GGML_OP_MUL_MAT) && (op->src[0]->buffer != (ggml_backend_buffer *)0x0)) &&
        (iVar5 = ggml_n_dims(), iVar5 == 2)) &&
       ((pgVar1 = op->src[0]->buffer->buft, ggml_backend_cpu_aarch64_buffer_type(),
        pgVar1 == &ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64 &&
        (ptVar6 = ggml_aarch64_get_optimal_repack_type(op->src[0]), ptVar6 != (tensor_traits *)0x0))
       )) || (((op->op == GGML_OP_MUL_MAT_ID &&
               ((op->src[0]->buffer != (ggml_backend_buffer *)0x0 &&
                (iVar5 = ggml_n_dims(), iVar5 == 3)))) &&
              ((pgVar1 = op->src[0]->buffer->buft, ggml_backend_cpu_aarch64_buffer_type(),
               pgVar1 == &ggml_backend_cpu_aarch64_buffer_type::ggml_backend_cpu_buffer_type_aarch64
               && (ptVar6 = ggml_aarch64_get_optimal_repack_type(op->src[0]),
                  ptVar6 != (tensor_traits *)0x0)))))) &&
     (((pgVar2 = op->src[1]->buffer, pgVar2 == (ggml_backend_buffer *)0x0 ||
       (cVar3 = ggml_backend_buft_is_host(pgVar2->buft), cVar3 != '\0')) &&
      (op->src[1]->type == GGML_TYPE_F32)))) {
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool supports_op(ggml_backend_dev_t, const struct ggml_tensor * op) override {
        if (    op->op == GGML_OP_MUL_MAT &&
                op->src[0]->buffer &&
                (ggml_n_dims(op->src[0]) == 2) &&
                op->src[0]->buffer->buft == ggml_backend_cpu_aarch64_buffer_type() &&
                ggml_aarch64_get_optimal_repack_type(op->src[0])
                ) {
            if (op->src[1]->buffer && !ggml_backend_buft_is_host(op->src[1]->buffer->buft)) {
                return false;
            }
            if (op->src[1]->type == GGML_TYPE_F32) {
                return true;
            }
            //if (op->src[1]->type == GGML_TYPE_Q8_0) {
            //    return true;
            //}
            // may be possible if Q8_0 packed...
        } else if (op->op == GGML_OP_MUL_MAT_ID
                && op->src[0]->buffer
                && (ggml_n_dims(op->src[0]) == 3)
                && op->src[0]->buffer->buft == ggml_backend_cpu_aarch64_buffer_type()
                && ggml_aarch64_get_optimal_repack_type(op->src[0])
                ) {
            if (op->src[1]->buffer && !ggml_backend_buft_is_host(op->src[1]->buffer->buft)) {
                return false;
            }
            if (op->src[1]->type == GGML_TYPE_F32) {
                return true;
            }
            //if (op->src[1]->type == GGML_TYPE_Q8_0) {
            //    return true;
            //}
        }
        return false;
    }